

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O1

void __thiscall InterpTest::Instantiate(InterpTest *this,RefVec *imports)

{
  Store *this_00;
  pointer pcVar1;
  Ref module;
  char *in_R9;
  AssertionResult gtest_ar_;
  RefPtr<wabt::interp::Trap> trap;
  internal local_1d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0;
  Ptr local_1c8;
  RefVec *local_1a8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1a0;
  undefined1 local_198 [32];
  AssertHelper local_178;
  string local_170;
  ModuleDesc local_150;
  
  this_00 = &this->store_;
  local_1a8 = imports;
  std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::vector
            (&local_150.func_types,&(this->module_desc_).func_types);
  std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::vector
            (&local_150.imports,&(this->module_desc_).imports);
  std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::vector
            (&local_150.funcs,&(this->module_desc_).funcs);
  std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>::vector
            (&local_150.tables,&(this->module_desc_).tables);
  std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>::vector
            (&local_150.memories,&(this->module_desc_).memories);
  std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>::vector
            (&local_150.globals,&(this->module_desc_).globals);
  std::vector<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>::vector
            (&local_150.tags,&(this->module_desc_).tags);
  std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>::vector
            (&local_150.exports,&(this->module_desc_).exports);
  std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>::vector
            (&local_150.starts,&(this->module_desc_).starts);
  std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>::vector
            (&local_150.elems,&(this->module_desc_).elems);
  std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>::vector
            (&local_150.datas,&(this->module_desc_).datas);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_150.istream.data_,&(this->module_desc_).istream.data_);
  wabt::interp::Store::Alloc<wabt::interp::Module,wabt::interp::Store&,wabt::interp::ModuleDesc>
            ((RefPtr<wabt::interp::Module> *)local_198,this_00,this_00,&local_150);
  (this->mod_).obj_ = (Module *)local_198._0_8_;
  (this->mod_).store_ = (Store *)local_198._8_8_;
  (this->mod_).root_index_ = local_198._16_8_;
  local_198._16_8_ = 0;
  local_198._0_8_ = (Module *)0x0;
  local_198._8_8_ = (Store *)0x0;
  wabt::interp::ModuleDesc::~ModuleDesc(&local_150);
  local_1c8.root_index_ = 0;
  local_1c8.obj_ = (Trap *)0x0;
  local_1c8.store_ = (Store *)0x0;
  module = wabt::interp::RefPtr<wabt::interp::Module>::ref(&this->mod_);
  wabt::interp::Instance::Instantiate((Ptr *)local_198,this_00,module,local_1a8,&local_1c8);
  (this->inst_).obj_ = (Instance *)local_198._0_8_;
  (this->inst_).store_ = (Store *)local_198._8_8_;
  (this->inst_).root_index_ = local_198._16_8_;
  local_1d8[0] = (internal)((this->inst_).obj_ != (Instance *)0x0);
  local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_1d8[0]) {
    testing::Message::Message((Message *)&local_1a0);
    pcVar1 = ((local_1c8.obj_)->message_)._M_dataplus._M_p;
    local_198._0_8_ = (Module *)(local_198 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_198,pcVar1,pcVar1 + ((local_1c8.obj_)->message_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1a0._M_head_impl + 0x10),(char *)local_198._0_8_,local_198._8_8_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,local_1d8,(AssertionResult *)"inst_","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
               ,0x2b,local_170._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    if ((Module *)local_198._0_8_ != (Module *)(local_198 + 0x10)) {
      operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
    }
    if (local_1a0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1a0._M_head_impl + 8))();
    }
  }
  if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d0,local_1d0);
  }
  if (local_1c8.obj_ != (Trap *)0x0) {
    wabt::interp::Store::DeleteRoot(local_1c8.store_,local_1c8.root_index_);
  }
  return;
}

Assistant:

void Instantiate(const RefVec& imports = RefVec{}) {
    mod_ = Module::New(store_, module_desc_);
    RefPtr<Trap> trap;
    inst_ = Instance::Instantiate(store_, mod_.ref(), imports, &trap);
    ASSERT_TRUE(inst_) << trap->message();
  }